

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O0

void __thiscall
FBuildTexture::FBuildTexture
          (FBuildTexture *this,int tilenum,BYTE *pixels,int width,int height,int left,int top)

{
  SWORD local_2c;
  WORD local_28;
  int left_local;
  int height_local;
  int width_local;
  BYTE *pixels_local;
  int tilenum_local;
  FBuildTexture *this_local;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FBuildTexture_00a07fc0;
  this->Pixels = pixels;
  this->Spans = (Span **)0x0;
  left_local._0_2_ = (WORD)width;
  (this->super_FTexture).Width = (WORD)left_local;
  local_28 = (WORD)height;
  (this->super_FTexture).Height = local_28;
  local_2c = (SWORD)left;
  (this->super_FTexture).LeftOffset = local_2c;
  (this->super_FTexture).TopOffset = (SWORD)top;
  FTexture::CalcBitSize(&this->super_FTexture);
  FString::Format(&(this->super_FTexture).Name,"BTIL%04d",(ulong)(uint)tilenum);
  (this->super_FTexture).UseType = '\x05';
  return;
}

Assistant:

FBuildTexture::FBuildTexture (int tilenum, const BYTE *pixels, int width, int height, int left, int top)
: Pixels (pixels), Spans (NULL)
{
	Width = width;
	Height = height;
	LeftOffset = left;
	TopOffset = top;
	CalcBitSize ();
	Name.Format("BTIL%04d", tilenum);
	UseType = TEX_Build;
}